

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

string * __thiscall
booster::locale::gnu_gettext::mo_message<char>::convert_encoding_name
          (string *__return_storage_ptr__,mo_message<char> *this,string *in)

{
  char cVar1;
  uint uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar2 = 0; (ulong)uVar2 < in->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = (in->_M_dataplus)._M_p[uVar2];
    if (((byte)(cVar1 + 0xbfU) < 0x1a) ||
       ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_encoding_name(std::string const &in)
                {
                    std::string result;
                    for(unsigned i=0;i<in.size();i++) {
                        char c=in[i];
                        if('A' <= c && c<='Z')
                            c=c-'A' + 'a';
                        else if(('a' <= c && c<='z') || ('0' <= c && c<='9'))
                            ;
                        else
                            continue;
                        result+=c;
                    }
                    return result;
                }